

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void freeList(list *list)

{
  token *__ptr;
  
  while (__ptr = list->first, __ptr != (token *)0x0) {
    list->first = __ptr->next;
    free(__ptr->value);
    free(__ptr);
  }
  free(list);
  return;
}

Assistant:

void freeList(struct list *list)
{
    struct token *node;

    while ((node = list->first) != NULL) {
        list->first = list->first->next;
        free(node->value);
        free(node);
    }

    free(list);
}